

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3WalFindFrame(Wal *pWal,Pgno pgno,u32 *piRead)

{
  uint uVar1;
  u32 *puVar2;
  int iVar3;
  u32 uVar4;
  u32 uVar5;
  uint uVar6;
  u32 uVar7;
  ushort *puVar8;
  uint uVar9;
  int iPage;
  ulong uVar10;
  u32 *aPgno;
  u32 *local_38;
  
  uVar1 = (pWal->hdr).mxFrame;
  if ((uVar1 == 0) || (pWal->readLock == 0)) {
    *piRead = 0;
  }
  else {
    uVar10 = (ulong)(uVar1 + 0x1000) + 0xffffffff021 >> 0xc;
    uVar4 = 0;
    if (-1 < (int)uVar10) {
      uVar6 = pgno * 0x17f & 0x1fff;
      do {
        iPage = (int)uVar10;
        iVar3 = walIndexPage(pWal,iPage,&local_38);
        if (iVar3 != 0) {
          return iVar3;
        }
        uVar7 = iPage * 0x1000 - 0x22;
        uVar4 = 0;
        puVar2 = local_38;
        if (iPage == 0) {
          uVar7 = uVar4;
          puVar2 = local_38 + 0x22;
        }
        if (*(short *)((long)local_38 + (ulong)uVar6 * 2 + 0x4000) != 0) {
          puVar8 = (ushort *)((long)local_38 + (ulong)uVar6 * 2 + 0x4000);
          uVar4 = 0;
          iVar3 = -0x2001;
          uVar10 = (ulong)uVar6;
          uVar5 = uVar4;
          do {
            uVar9 = *puVar8 + uVar7;
            if ((uVar9 <= uVar1) && (uVar4 = uVar5, puVar2[(ulong)*puVar8 - 1] == pgno)) {
              uVar4 = uVar9;
              uVar5 = uVar9;
            }
            iVar3 = iVar3 + 1;
            if (iVar3 == 0) {
              sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xbaf7,
                          "118a3b35693b134d56ebd780123b7fd6f1497668");
              return 0xb;
            }
            uVar10 = (ulong)((int)uVar10 + 1U & 0x1fff);
            puVar8 = (ushort *)((long)local_38 + uVar10 * 2 + 0x4000);
          } while (*puVar8 != 0);
        }
      } while ((0 < iPage) && (uVar10 = (ulong)(iPage - 1), uVar4 == 0));
    }
    *piRead = uVar4;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalFindFrame(
  Wal *pWal,                      /* WAL handle */
  Pgno pgno,                      /* Database page number to read data for */
  u32 *piRead                     /* OUT: Frame number (or zero) */
){
  u32 iRead = 0;                  /* If !=0, WAL frame to return data from */
  u32 iLast = pWal->hdr.mxFrame;  /* Last page in WAL for this reader */
  int iHash;                      /* Used to loop through N hash tables */

  /* This routine is only be called from within a read transaction. */
  assert( pWal->readLock>=0 || pWal->lockError );

  /* If the "last page" field of the wal-index header snapshot is 0, then
  ** no data will be read from the wal under any circumstances. Return early
  ** in this case as an optimization.  Likewise, if pWal->readLock==0, 
  ** then the WAL is ignored by the reader so return early, as if the 
  ** WAL were empty.
  */
  if( iLast==0 || pWal->readLock==0 ){
    *piRead = 0;
    return SQLITE_OK;
  }

  /* Search the hash table or tables for an entry matching page number
  ** pgno. Each iteration of the following for() loop searches one
  ** hash table (each hash table indexes up to HASHTABLE_NPAGE frames).
  **
  ** This code might run concurrently to the code in walIndexAppend()
  ** that adds entries to the wal-index (and possibly to this hash 
  ** table). This means the value just read from the hash 
  ** slot (aHash[iKey]) may have been added before or after the 
  ** current read transaction was opened. Values added after the
  ** read transaction was opened may have been written incorrectly -
  ** i.e. these slots may contain garbage data. However, we assume
  ** that any slots written before the current read transaction was
  ** opened remain unmodified.
  **
  ** For the reasons above, the if(...) condition featured in the inner
  ** loop of the following block is more stringent that would be required 
  ** if we had exclusive access to the hash-table:
  **
  **   (aPgno[iFrame]==pgno): 
  **     This condition filters out normal hash-table collisions.
  **
  **   (iFrame<=iLast): 
  **     This condition filters out entries that were added to the hash
  **     table after the current read-transaction had started.
  */
  for(iHash=walFramePage(iLast); iHash>=0 && iRead==0; iHash--){
    volatile ht_slot *aHash;      /* Pointer to hash table */
    volatile u32 *aPgno;          /* Pointer to array of page numbers */
    u32 iZero;                    /* Frame number corresponding to aPgno[0] */
    int iKey;                     /* Hash slot index */
    int nCollide;                 /* Number of hash collisions remaining */
    int rc;                       /* Error code */

    rc = walHashGet(pWal, iHash, &aHash, &aPgno, &iZero);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    nCollide = HASHTABLE_NSLOT;
    for(iKey=walHash(pgno); aHash[iKey]; iKey=walNextHash(iKey)){
      u32 iFrame = aHash[iKey] + iZero;
      if( iFrame<=iLast && aPgno[aHash[iKey]]==pgno ){
        /* assert( iFrame>iRead ); -- not true if there is corruption */
        iRead = iFrame;
      }
      if( (nCollide--)==0 ){
        return SQLITE_CORRUPT_BKPT;
      }
    }
  }

#ifdef SQLITE_ENABLE_EXPENSIVE_ASSERT
  /* If expensive assert() statements are available, do a linear search
  ** of the wal-index file content. Make sure the results agree with the
  ** result obtained using the hash indexes above.  */
  {
    u32 iRead2 = 0;
    u32 iTest;
    for(iTest=iLast; iTest>0; iTest--){
      if( walFramePgno(pWal, iTest)==pgno ){
        iRead2 = iTest;
        break;
      }
    }
    assert( iRead==iRead2 );
  }
#endif

  *piRead = iRead;
  return SQLITE_OK;
}